

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

bool __thiscall google::protobuf::safe_strtob(protobuf *this,StringPiece str,bool *value)

{
  protobuf pVar1;
  byte bVar2;
  protobuf pVar3;
  uint uVar4;
  bool bVar5;
  undefined1 uVar6;
  LogMessage *pLVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  LogMessage local_a8;
  StringPiece local_70;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  LogFinisher local_29;
  
  s1.length_ = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/strutil.cc"
               ,0x51f);
    pLVar7 = internal::LogMessage::operator<<(&local_a8,"CHECK failed: value != nullptr: ");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,"nullptr output boolean given.");
    internal::LogFinisher::operator=(&local_29,pLVar7);
    internal::LogMessage::~LogMessage(&local_a8);
  }
  switch(s1.length_) {
  case (char *)0x1:
switchD_002527e8_caseD_1:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x361d82];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_0025284c;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_0025284c:
    if (iVar9 == 0) goto LAB_00252b5b;
    if (s1.length_ == (char *)0x1) {
LAB_0025297e:
      pcVar8 = (char *)0x0;
      do {
        pVar1 = this[(long)pcVar8];
        pVar3 = (protobuf)((char)pVar1 + 0x20);
        if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
          pVar3 = pVar1;
        }
        bVar2 = pcVar8[0x357b11];
        uVar4 = bVar2 + 0x20 & 0xff;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          uVar4 = (uint)bVar2;
        }
        iVar9 = (byte)pVar3 - uVar4;
        if (pVar3 != SUB41(uVar4,0)) goto LAB_002529e0;
        pcVar8 = pcVar8 + 1;
      } while (s1.length_ != pcVar8);
      iVar9 = 0;
LAB_002529e0:
      uVar6 = 1;
      if (iVar9 == 0) goto LAB_00252b5d;
      if (s1.length_ == (char *)0x5) goto switchD_002527e8_caseD_5;
      if (s1.length_ == (char *)0x1) {
        lVar10 = 0;
        do {
          pVar1 = this[lVar10];
          pVar3 = (protobuf)((char)pVar1 + 0x20);
          if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
            pVar3 = pVar1;
          }
          bVar2 = "$0message $1"[lVar10 + 0xb];
          uVar4 = bVar2 + 0x20 & 0xff;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            uVar4 = (uint)bVar2;
          }
          iVar9 = (byte)pVar3 - uVar4;
          if (pVar3 != SUB41(uVar4,0)) goto LAB_00252a5e;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 1);
        iVar9 = 0;
LAB_00252a5e:
        if (iVar9 == 0) goto LAB_00252b5d;
      }
    }
    else {
      if (s1.length_ == (char *)0x5) goto switchD_002527e8_caseD_5;
      if (s1.length_ == (char *)0x3) goto switchD_002527e8_caseD_3;
    }
    break;
  case (char *)0x3:
switchD_002527e8_caseD_3:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x350402];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_00252962;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_00252962:
    if (iVar9 == 0) {
LAB_00252b5b:
      uVar6 = 1;
      goto LAB_00252b5d;
    }
    if (s1.length_ == (char *)0x5) goto switchD_002527e8_caseD_5;
    if (s1.length_ == (char *)0x1) goto LAB_0025297e;
    break;
  case (char *)0x4:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x3503fd];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_002528d9;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_002528d9:
    if (iVar9 == 0) goto LAB_00252b5b;
    if (s1.length_ == (char *)0x5) goto switchD_002527e8_caseD_5;
    if (s1.length_ == (char *)0x3) goto switchD_002527e8_caseD_3;
    if (s1.length_ == (char *)0x1) goto switchD_002527e8_caseD_1;
    break;
  case (char *)0x5:
switchD_002527e8_caseD_5:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x350406];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_00252ace;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_00252ace:
    if (iVar9 != 0) break;
    goto LAB_00252b57;
  }
  StringPiece::StringPiece(&local_70,"f");
  s1.ptr_ = (char *)this;
  bVar5 = CaseEqual(s1,local_70);
  if (!bVar5) {
    StringPiece::StringPiece(&local_60,"no");
    s1_00.length_ = (stringpiece_ssize_type)s1.length_;
    s1_00.ptr_ = (char *)this;
    bVar5 = CaseEqual(s1_00,local_60);
    if (!bVar5) {
      StringPiece::StringPiece(&local_50,"n");
      s1_01.length_ = (stringpiece_ssize_type)s1.length_;
      s1_01.ptr_ = (char *)this;
      bVar5 = CaseEqual(s1_01,local_50);
      if (!bVar5) {
        StringPiece::StringPiece(&local_40,"0");
        s1_02.length_ = (stringpiece_ssize_type)s1.length_;
        s1_02.ptr_ = (char *)this;
        bVar5 = CaseEqual(s1_02,local_40);
        uVar6 = 0;
        if (!bVar5) {
          return false;
        }
        goto LAB_00252b5d;
      }
    }
  }
LAB_00252b57:
  uVar6 = 0;
LAB_00252b5d:
  *(undefined1 *)str.length_ = uVar6;
  return true;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}